

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

size_t kj::anon_unknown_0::getSmallStackSize(void)

{
  size_t sVar1;
  
  sVar1 = __sysconf(0x4b);
  if (0x3ffff < (long)sVar1) {
    sVar1 = 0x40000;
  }
  if ((long)sVar1 < 0x4001) {
    sVar1 = 0x4000;
  }
  return sVar1;
}

Assistant:

inline size_t getSmallStackSize() {
#if !_WIN32
  // pthread_attr_setstacksize() requires a stack size of at least PTHREAD_STACK_MIN, which can
  // vary by platform.  We'll clamp that to a reasonable range for stack overflow tests, and skip
  // the pthread-based tests if we can't get it.
  return kj::max(16 * 1024, kj::min(256 * 1024, PTHREAD_STACK_MIN));
#else
  return 16 * 1024;
#endif
}